

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

int ma_dr_mp3dec_decode_frame
              (ma_dr_mp3dec *dec,ma_uint8 *mp3,int mp3_bytes,void *pcm,ma_dr_mp3dec_frame_info *info
              )

{
  long lVar1;
  ma_dr_mp3_L3_gr_info *pmVar2;
  float *dst;
  char *pcVar3;
  ma_uint8 mVar4;
  ma_uint8 mVar5;
  byte bVar6;
  ushort uVar7;
  short sVar8;
  short sVar9;
  ma_uint16 mVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined8 uVar24;
  ma_uint8 mVar25;
  ma_uint8 mVar26;
  byte bVar27;
  int i;
  uint uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  ma_uint32 mVar34;
  uint uVar35;
  ma_uint32 mVar36;
  ma_uint32 mVar37;
  uint uVar38;
  long lVar39;
  long lVar40;
  byte bVar41;
  byte bVar42;
  sbyte sVar43;
  bool bVar44;
  uint uVar45;
  ulong uVar46;
  float (*pafVar47) [576];
  ma_dr_mp3dec_scratch *pmVar48;
  bool bVar49;
  float (*pafVar50) [64];
  int iVar51;
  int iVar52;
  uint uVar53;
  uint uVar54;
  ulong uVar55;
  ma_dr_mp3_L12_scale_info *pmVar56;
  float *pfVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  ulong uVar61;
  ulong uVar62;
  uint uVar63;
  undefined1 *puVar64;
  void *pvVar65;
  float (*overlap) [288];
  float *pfVar66;
  uint uVar67;
  ma_dr_mp3dec_scratch *pmVar68;
  void *__dest;
  byte bVar69;
  uint uVar70;
  ulong uVar71;
  uint *puVar72;
  byte *pbVar73;
  long lVar74;
  float (*pafVar75) [576];
  int iVar76;
  int iVar77;
  uint uVar78;
  ulong uVar79;
  ma_dr_mp3_L3_gr_info *pmVar80;
  undefined1 *puVar81;
  ma_uint8 *pmVar82;
  ma_uint8 *pmVar83;
  ma_uint8 (*__src) [39];
  byte bVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float *local_43f8;
  float (*local_43f0) [576];
  ulong local_43e0;
  uint local_43b8;
  ma_uint8 scf_size [4];
  ma_dr_mp3_bs bs_frame [1];
  ulong local_4380;
  ma_dr_mp3d_sample_t *local_4370;
  ma_dr_mp3_L12_scale_info sci [1];
  ma_dr_mp3dec_scratch scratch;
  
  bVar27 = 0;
  if (((4 < mp3_bytes) && (dec->header[0] == 0xff)) &&
     (iVar29 = ma_dr_mp3_hdr_compare(dec->header,mp3), iVar29 != 0)) {
    iVar29 = ma_dr_mp3_hdr_frame_bytes(mp3,dec->free_format_bytes);
    iVar77 = ma_dr_mp3_hdr_padding(mp3);
    iVar77 = iVar77 + iVar29;
    iVar51 = 0;
    iVar29 = mp3_bytes;
    if ((iVar77 == mp3_bytes) ||
       (((iVar77 + 4 <= mp3_bytes && (iVar30 = ma_dr_mp3_hdr_compare(mp3,mp3 + iVar77), iVar77 != 0)
         ) && (iVar29 = iVar77, iVar30 != 0)))) goto LAB_00156cbb;
  }
  iVar77 = 8;
  memset(dec,0,0x1a0c);
  uVar28 = mp3_bytes - 4;
  uVar46 = 0;
  if (0 < (int)uVar28) {
    uVar46 = (ulong)uVar28;
  }
  pmVar82 = mp3;
  for (uVar55 = 0; uVar55 != uVar46; uVar55 = uVar55 + 1) {
    iVar29 = ma_dr_mp3_hdr_valid(pmVar82);
    if (iVar29 != 0) {
      iVar30 = ma_dr_mp3_hdr_frame_bytes(pmVar82,0);
      iVar29 = ma_dr_mp3_hdr_padding(pmVar82);
      local_43e0 = (ulong)(uint)(iVar29 + iVar30);
      iVar51 = iVar77;
      for (uVar79 = 4; (iVar29 = (int)local_43e0, iVar30 == 0 && (uVar79 < 0x900));
          uVar79 = uVar79 + 1) {
        if ((int)uVar28 <= iVar51) goto LAB_00156bfb;
        pmVar83 = pmVar82 + uVar79;
        iVar29 = ma_dr_mp3_hdr_compare(pmVar82,pmVar83);
        iVar30 = 0;
        if (iVar29 != 0) {
          iVar29 = ma_dr_mp3_hdr_padding(pmVar82);
          iVar31 = ma_dr_mp3_hdr_padding(pmVar83);
          if ((iVar31 - iVar29) + iVar51 + 4 <= mp3_bytes) {
            iVar31 = ma_dr_mp3_hdr_compare
                               (pmVar82,pmVar83 + (uint)((iVar31 + (int)uVar79) - iVar29));
            if (iVar31 != 0) {
              iVar30 = (int)uVar79 - iVar29;
              dec->free_format_bytes = iVar30;
              local_43e0 = uVar79 & 0xffffffff;
            }
          }
        }
        iVar51 = iVar51 + 2;
      }
      if (iVar30 != 0) {
        iVar51 = (int)uVar55;
        iVar31 = iVar51 + iVar29;
        if (iVar31 <= mp3_bytes) {
          iVar52 = 0;
          iVar76 = 0;
          while( true ) {
            if (iVar52 == -10) goto LAB_00156ca5;
            iVar32 = ma_dr_mp3_hdr_frame_bytes(pmVar82 + iVar76,iVar30);
            iVar33 = ma_dr_mp3_hdr_padding(pmVar82 + iVar76);
            if ((long)((long)mp3_bytes - uVar55) < (long)(iVar33 + iVar76 + iVar32 + 4)) break;
            iVar76 = iVar76 + iVar32 + iVar33;
            iVar32 = ma_dr_mp3_hdr_compare(pmVar82,pmVar82 + iVar76);
            if (iVar32 == 0) goto LAB_00156bfb;
            iVar52 = iVar52 + -1;
          }
          if (iVar52 != 0) goto LAB_00156ca1;
        }
      }
LAB_00156bfb:
      if ((uVar55 == 0) && (iVar29 == mp3_bytes)) {
        iVar51 = 0;
        iVar29 = mp3_bytes;
        goto LAB_00156ca1;
      }
      dec->free_format_bytes = 0;
    }
    pmVar82 = pmVar82 + 1;
    iVar77 = iVar77 + 1;
  }
  iVar29 = 0;
  iVar51 = mp3_bytes;
LAB_00156ca1:
  iVar31 = iVar51 + iVar29;
LAB_00156ca5:
  if ((iVar29 == 0) || (mp3_bytes < iVar31)) {
    info->frame_bytes = iVar51;
    return 0;
  }
LAB_00156cbb:
  pmVar82 = mp3 + iVar51;
  pmVar83 = mp3 + iVar51;
  *(undefined4 *)dec->header = *(undefined4 *)pmVar82;
  info->frame_bytes = iVar51 + iVar29;
  uVar28 = (pmVar82[3] < 0xc0) + 1;
  local_4380 = (ulong)uVar28;
  info->channels = uVar28;
  uVar28 = ma_dr_mp3_hdr_sample_rate_hz(pmVar83);
  info->hz = uVar28;
  uVar58 = pmVar82[1] >> 1 & 3;
  info->layer = 4 - uVar58;
  uVar28 = ma_dr_mp3_hdr_bitrate_kbps(pmVar83);
  info->bitrate_kbps = uVar28;
  bs_frame[0].buf = pmVar82 + 4;
  bs_frame[0].pos = 0;
  bs_frame[0].limit = iVar29 * 8 + -0x20;
  bVar42 = pmVar82[1];
  if ((bVar42 & 1) == 0) {
    ma_dr_mp3_bs_get_bits(bs_frame,0x10);
  }
  local_4370 = (ma_dr_mp3d_sample_t *)pcm;
  if ((char)uVar58 == '\x01') {
    bVar69 = pmVar83[3];
    mVar36 = 0;
    uVar28 = (bVar69 < 0xc0) + 1;
    iVar29 = ((bVar42 >> 3 & 1) + (uint)((bVar42 >> 4 & 1) != 0)) * 3 + (pmVar83[2] >> 2 & 3);
    if ((bVar42 & 8) == 0) {
      mVar34 = ma_dr_mp3_bs_get_bits(bs_frame,uVar28 | 8);
      uVar35 = mVar34 >> (sbyte)uVar28;
      uVar58 = uVar28;
    }
    else {
      uVar58 = uVar28 * 2;
      uVar35 = ma_dr_mp3_bs_get_bits(bs_frame,9);
      mVar36 = ma_dr_mp3_bs_get_bits(bs_frame,uVar28 * 2 + 7);
    }
    lVar39 = (long)(int)(iVar29 + -1 + (uint)(iVar29 == 0));
    iVar29 = 0;
    pmVar82 = &scratch.gr_info[0].scfsi;
    do {
      uVar28 = mVar36 << 4;
      if (bVar69 < 0xc0) {
        uVar28 = mVar36;
      }
      uVar46 = (ulong)uVar28;
      mVar36 = ma_dr_mp3_bs_get_bits(bs_frame,0xc);
      *(ma_uint16 *)(pmVar82 + -0x17) = (ma_uint16)mVar36;
      mVar34 = ma_dr_mp3_bs_get_bits(bs_frame,9);
      *(ma_uint16 *)(pmVar82 + -0x15) = (ma_uint16)mVar34;
      if (0x120 < (mVar34 & 0xffff)) goto LAB_00158705;
      mVar34 = ma_dr_mp3_bs_get_bits(bs_frame,8);
      pmVar82[-0x11] = (byte)mVar34;
      mVar34 = ma_dr_mp3_bs_get_bits(bs_frame,(uint)((bVar42 & 8) == 0) * 5 + 4);
      *(ma_uint16 *)(pmVar82 + -0x13) = (ma_uint16)mVar34;
      ((ma_dr_mp3_L3_gr_info *)(pmVar82 + -0x1f))->sfbtab =
           ma_dr_mp3_L3_read_side_info(ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info*,unsigned_char_const*)::
           g_scf_long + lVar39 * 0x17;
      *(undefined2 *)(pmVar82 + -0xe) = 0x16;
      mVar34 = ma_dr_mp3_bs_get_bits(bs_frame,1);
      if (mVar34 == 0) {
        *(undefined2 *)(pmVar82 + -0x10) = 0;
        mVar34 = ma_dr_mp3_bs_get_bits(bs_frame,0xf);
        mVar37 = ma_dr_mp3_bs_get_bits(bs_frame,4);
        pmVar82[-9] = (byte)mVar37;
        mVar37 = ma_dr_mp3_bs_get_bits(bs_frame,3);
        pmVar82[-8] = (byte)mVar37;
        pmVar82[-7] = 0xff;
      }
      else {
        mVar34 = ma_dr_mp3_bs_get_bits(bs_frame,2);
        pmVar82[-0x10] = (byte)mVar34;
        if ((byte)mVar34 == 0) goto LAB_00158705;
        mVar34 = ma_dr_mp3_bs_get_bits(bs_frame,1);
        pmVar82[-0xf] = (byte)mVar34;
        pmVar82[-9] = '\a';
        pmVar82[-8] = 0xff;
        if (pmVar82[-0x10] == 2) {
          bVar41 = 0x1e;
          puVar64 = ma_dr_mp3_L3_read_side_info(ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info*,unsigned_char_const*)
                    ::g_scf_mixed;
          bVar84 = ((bVar42 & 8) >> 2) + 6;
          if ((byte)mVar34 == 0) {
            pmVar82[-9] = 8;
            bVar41 = 0x27;
            bVar84 = 0;
            puVar64 = ma_dr_mp3_L3_read_side_info(ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info*,unsigned_char_const*)
                      ::g_scf_short;
          }
          uVar46 = (ulong)(uVar28 & 0xf0f);
          ((ma_dr_mp3_L3_gr_info *)(pmVar82 + -0x1f))->sfbtab = puVar64 + lVar39 * 0x28;
          pmVar82[-0xe] = bVar84;
          pmVar82[-0xd] = bVar41;
        }
        mVar34 = ma_dr_mp3_bs_get_bits(bs_frame,10);
        mVar34 = mVar34 << 5;
        mVar37 = ma_dr_mp3_bs_get_bits(bs_frame,3);
        pmVar82[-6] = (byte)mVar37;
        mVar37 = ma_dr_mp3_bs_get_bits(bs_frame,3);
        pmVar82[-5] = (byte)mVar37;
        mVar37 = ma_dr_mp3_bs_get_bits(bs_frame,3);
        pmVar82[-4] = (byte)mVar37;
      }
      pmVar82[-0xc] = (byte)(mVar34 >> 10);
      pmVar82[-0xb] = (byte)(mVar34 >> 5) & 0x1f;
      pmVar82[-10] = (byte)mVar34 & 0x1f;
      if ((bVar42 & 8) == 0) {
        bVar84 = 499 < *(ushort *)(pmVar82 + -0x13);
      }
      else {
        mVar34 = ma_dr_mp3_bs_get_bits(bs_frame,1);
        bVar84 = (byte)mVar34;
      }
      iVar29 = iVar29 + (mVar36 & 0xffff);
      pmVar82[-3] = bVar84;
      mVar36 = ma_dr_mp3_bs_get_bits(bs_frame,1);
      pmVar82[-2] = (byte)mVar36;
      mVar36 = ma_dr_mp3_bs_get_bits(bs_frame,1);
      iVar51 = bs_frame[0].pos;
      pmVar82[-1] = (byte)mVar36;
      *pmVar82 = (byte)(uVar46 >> 0xc) & 0xf;
      mVar36 = (int)uVar46 << 4;
      pmVar82 = pmVar82 + 0x20;
      uVar58 = uVar58 - 1;
    } while (uVar58 != 0);
    if ((bs_frame[0].pos <= bs_frame[0].limit && -1 < (int)uVar35) &&
        iVar29 + bs_frame[0].pos <= (int)(bs_frame[0].limit + uVar35 * 8)) {
      uVar28 = dec->reserv;
      uVar58 = uVar35;
      if ((int)uVar28 < (int)uVar35) {
        uVar58 = uVar28;
      }
      uVar53 = 0;
      uVar46 = (ulong)(uVar28 - uVar35);
      if ((int)(uVar28 - uVar35) < 1) {
        uVar46 = 0;
      }
      pmVar82 = scratch.maindata;
      iVar29 = (bs_frame[0].limit - bs_frame[0].pos) / 8;
      memcpy(pmVar82,dec->reserv_buf + uVar46,(long)(int)uVar58);
      memcpy(scratch.maindata + (int)uVar58,bs_frame[0].buf + iVar51 / 8,(long)iVar29);
      scratch.bs.pos = 0;
      scratch.bs.limit = (iVar29 + uVar58) * 8;
      scratch.bs.buf = pmVar82;
      if ((pcm != (void *)0x0) && ((int)uVar35 <= (int)uVar28)) {
        for (uVar58 = 0; uVar58 < 2 - ((bVar42 & 8) == 0); uVar58 = uVar58 + 1) {
          memset(scratch.grbuf,0,0x1200);
          lVar39 = (long)(int)((int)local_4380 * uVar58);
          pmVar80 = scratch.gr_info + lVar39;
          uVar46 = local_4380 & 0xffffffff;
          if ((int)local_4380 < 1) {
            uVar46 = 0;
          }
          uVar55 = 0;
LAB_0015724c:
          if (uVar55 != uVar46) {
            lVar40 = (long)scratch.bs.pos;
            pmVar2 = pmVar80 + uVar55;
            uVar7 = scratch.gr_info[lVar39 + uVar55].part_23_length;
            puVar64 = ma_dr_mp3_L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float*,int)
                      ::g_scf_partitions +
                      (((ulong)(scratch.gr_info[lVar39 + uVar55].n_long_sfb == '\0') + 1) -
                      (ulong)(scratch.gr_info[lVar39 + uVar55].n_short_sfb == '\0')) * 0x1c;
            mVar26 = scratch.gr_info[lVar39 + uVar55].scalefac_scale;
            if ((dec->header[1] & 8) == 0) {
              bVar42 = uVar55 != 0 & (dec->header[3] & 0x10) >> 4;
              uVar61 = (ulong)(pmVar2->scalefac_compress >> bVar42);
              uVar79 = 0;
              if (bVar42 != 0) {
                uVar79 = 0xc;
              }
              while( true ) {
                if ((int)uVar61 < 0) break;
                uVar71 = 3;
                uVar62 = 1;
                while( true ) {
                  iVar29 = (int)uVar71;
                  if (iVar29 < 0) break;
                  bVar42 = ma_dr_mp3_L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float*,int)
                           ::g_mod[(uint)((int)uVar79 + iVar29)];
                  scf_size[uVar71] = (ma_uint8)((uVar61 / uVar62) % (ulong)bVar42);
                  uVar62 = (ulong)((int)uVar62 * (uint)bVar42);
                  uVar71 = (ulong)(iVar29 - 1);
                }
                uVar61 = (ulong)(uint)((int)uVar61 - (int)uVar62);
                uVar79 = (ulong)((int)uVar79 + 4);
              }
              puVar64 = puVar64 + uVar79;
              uVar53 = 0xfffffff0;
            }
            else {
              uVar53 = (uint)pmVar2->scfsi;
              scf_size[0] = (byte)ma_dr_mp3_L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float*,int)
                                  ::g_scfc_decode[pmVar2->scalefac_compress] >> 2;
              scf_size[1] = scf_size[0];
              scf_size[2] = ma_dr_mp3_L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float*,int)
                            ::g_scfc_decode[pmVar2->scalefac_compress] & 3;
              scf_size[3] = scf_size[2];
            }
            lVar40 = lVar40 + (ulong)uVar7;
            __src = scratch.ist_pos + uVar55;
            pmVar56 = sci;
            for (lVar74 = 0; (lVar74 != 4 && (uVar79 = (ulong)(byte)puVar64[lVar74], uVar79 != 0));
                lVar74 = lVar74 + 1) {
              if ((uVar53 & 8) == 0) {
                bVar42 = scf_size[lVar74];
                if (bVar42 == 0) {
                  memset(pmVar56,0,uVar79);
                  memset(__src,0,uVar79);
                }
                else {
                  uVar63 = ~(-1 << (bVar42 & 0x1f));
                  if (-1 < (int)uVar53) {
                    uVar63 = 0xffffffff;
                  }
                  for (uVar61 = 0; uVar79 != uVar61; uVar61 = uVar61 + 1) {
                    mVar36 = ma_dr_mp3_bs_get_bits(&scratch.bs,(uint)bVar42);
                    mVar25 = (ma_uint8)mVar36;
                    *(ma_uint8 *)((long)pmVar56->scf + uVar61) = mVar25;
                    if (mVar36 == uVar63) {
                      mVar25 = 0xff;
                    }
                    (*__src)[uVar61] = mVar25;
                  }
                }
              }
              else {
                memcpy(pmVar56,__src,uVar79);
              }
              __src = (ma_uint8 (*) [39])(*__src + uVar79);
              pmVar56 = (ma_dr_mp3_L12_scale_info *)((long)pmVar56->scf + uVar79);
              uVar53 = uVar53 * 2;
            }
            *(undefined1 *)((long)pmVar56->scf + 2) = 0;
            *(undefined2 *)pmVar56->scf = 0;
            uVar79 = (ulong)pmVar2->n_short_sfb;
            if (uVar79 == 0) {
              if (pmVar2->preflag != '\0') {
                for (lVar74 = 0; lVar74 != 10; lVar74 = lVar74 + 1) {
                  pcVar3 = (char *)((long)sci[0].scf + lVar74 + 0xb);
                  *pcVar3 = *pcVar3 + (&ma_dr_mp3_L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float*,int)
                                        ::g_preamp)[lVar74];
                }
              }
            }
            else {
              mVar25 = pmVar2->subblock_gain[0];
              bVar42 = 2 - mVar26;
              mVar4 = pmVar2->subblock_gain[1];
              uVar62 = (ulong)pmVar2->n_long_sfb;
              mVar5 = pmVar2->subblock_gain[2];
              for (uVar61 = 0; uVar61 < uVar79; uVar61 = uVar61 + 3) {
                pcVar3 = (char *)((long)sci[0].scf + uVar61 + uVar62);
                *pcVar3 = *pcVar3 + (mVar25 << (bVar42 & 0x1f));
                pcVar3 = (char *)((long)sci[0].scf + uVar61 + uVar62 + 1);
                *pcVar3 = *pcVar3 + (mVar4 << (bVar42 & 0x1f));
                pcVar3 = (char *)((long)sci[0].scf + uVar61 + uVar62 + 2);
                *pcVar3 = *pcVar3 + (mVar5 << (bVar42 & 0x1f));
              }
            }
            fVar85 = ma_dr_mp3_L3_ldexp_q2
                               (2048.0,((uint)((dec->header[3] & 0xe0) == 0x60) * 2 -
                                       (uint)pmVar2->global_gain) + 0x102);
            bVar42 = pmVar2->n_long_sfb;
            for (lVar74 = 0; bVar42 + uVar79 != lVar74; lVar74 = lVar74 + 1) {
              fVar86 = ma_dr_mp3_L3_ldexp_q2
                                 (fVar85,(uint)*(byte *)((long)sci[0].scf + lVar74) <<
                                         (mVar26 + 1 & 0x1f));
              scratch.scf[lVar74] = fVar86;
            }
            pafVar47 = scratch.grbuf + uVar55;
            uVar70 = (uint)pmVar2->big_values;
            pbVar73 = pmVar2->sfbtab;
            puVar72 = (uint *)((long)(scratch.bs.buf + scratch.bs.pos / 8) + 4);
            uVar53 = *(uint *)(scratch.bs.buf + scratch.bs.pos / 8);
            uVar53 = (uVar53 >> 0x18 | (uVar53 & 0xff0000) >> 8 | (uVar53 & 0xff00) << 8 |
                     uVar53 << 0x18) << ((byte)scratch.bs.pos & 7);
            uVar63 = scratch.bs.pos | 0xfffffff8;
            fVar85 = 0.0;
            local_43f8 = scratch.scf;
            lVar74 = 0;
            while (0 < (int)uVar70) {
              bVar42 = pmVar2->table_select[lVar74];
              lVar1 = lVar74 + 1;
              sVar8 = *(short *)(ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                                 ::tabindex + (ulong)bVar42 * 2);
              uVar54 = uVar70;
              uVar45 = (uint)pmVar2->region_count[lVar74];
              if (bVar42 < 0x10) {
                do {
                  uVar67 = (uint)(*pbVar73 >> 1);
                  uVar70 = uVar67;
                  if (uVar54 < uVar67) {
                    uVar70 = uVar54;
                  }
                  fVar85 = *local_43f8;
                  do {
                    pafVar75 = pafVar47;
                    uVar59 = uVar53 >> 0x1b;
                    uVar38 = 5;
                    while( true ) {
                      sVar9 = *(short *)(ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                                         ::tabs + (ulong)uVar59 * 2 + (long)sVar8 * 2);
                      uVar59 = (uint)sVar9;
                      if (-1 < sVar9) break;
                      uVar53 = uVar53 << (sbyte)uVar38;
                      uVar63 = uVar63 + uVar38;
                      uVar38 = uVar59 & 7;
                      uVar59 = (uVar53 >> (-(char)uVar38 & 0x1fU)) - ((int)uVar59 >> 3);
                    }
                    uVar53 = uVar53 << ((byte)((ushort)sVar9 >> 8) & 0x1f);
                    uVar63 = uVar63 + (uVar59 >> 8);
                    for (lVar74 = 0; (int)lVar74 != 8; lVar74 = lVar74 + 4) {
                      uVar60 = uVar59 & 0xf;
                      uVar38 = uVar53 >> 0x1b;
                      uVar53 = uVar53 << (uVar60 != 0);
                      *(float *)((long)*pafVar75 + lVar74) =
                           g_ma_dr_mp3_pow43[(uVar38 & 0xfffffff0 | uVar60) ^ 0x10] * fVar85;
                      uVar63 = uVar63 + (uVar60 != 0);
                      uVar59 = uVar59 >> 4;
                    }
                    for (; -1 < (int)uVar63; uVar63 = uVar63 - 8) {
                      uVar38 = *puVar72;
                      puVar72 = (uint *)((long)puVar72 + 1);
                      uVar53 = uVar53 | (uint)(byte)uVar38 << ((byte)uVar63 & 0x1f);
                    }
                    uVar70 = uVar70 - 1;
                    pafVar47 = (float (*) [576])((long)*pafVar75 + lVar74);
                  } while (uVar70 != 0);
                  pbVar73 = pbVar73 + 1;
                  local_43f8 = local_43f8 + 1;
                  uVar70 = uVar54 - uVar67;
                  if (uVar70 == 0 || (int)uVar54 < (int)uVar67) break;
                  pafVar47 = (float (*) [576])((long)*pafVar75 + lVar74);
                  bVar44 = 0 < (int)uVar45;
                  uVar54 = uVar70;
                  uVar45 = uVar45 - 1;
                } while (bVar44);
                pafVar47 = (float (*) [576])((long)*pafVar75 + lVar74);
                lVar74 = lVar1;
              }
              else {
                bVar42 = ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                         ::g_linbits[bVar42];
                do {
                  uVar67 = (uint)(*pbVar73 >> 1);
                  uVar70 = uVar67;
                  if (uVar54 < uVar67) {
                    uVar70 = uVar54;
                  }
                  fVar85 = *local_43f8;
                  do {
                    uVar59 = uVar53 >> 0x1b;
                    uVar38 = 5;
                    while( true ) {
                      sVar9 = *(short *)(ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                                         ::tabs + (ulong)uVar59 * 2 + (long)sVar8 * 2);
                      uVar59 = (uint)sVar9;
                      if (-1 < sVar9) break;
                      uVar53 = uVar53 << (sbyte)uVar38;
                      uVar63 = uVar63 + uVar38;
                      uVar38 = uVar59 & 7;
                      uVar59 = (uVar53 >> (-(char)uVar38 & 0x1fU)) - ((int)uVar59 >> 3);
                    }
                    uVar53 = uVar53 << ((byte)((ushort)sVar9 >> 8) & 0x1f);
                    uVar63 = uVar63 + (uVar59 >> 8);
                    for (iVar29 = 0; iVar29 != 2; iVar29 = iVar29 + 1) {
                      uVar38 = uVar59 & 0xf;
                      if (uVar38 == 0xf) {
                        uVar60 = uVar53 << (bVar42 & 0x1f);
                        for (uVar63 = uVar63 + bVar42; -1 < (int)uVar63; uVar63 = uVar63 - 8) {
                          uVar38 = *puVar72;
                          puVar72 = (uint *)((long)puVar72 + 1);
                          uVar60 = uVar60 | (uint)(byte)uVar38 << ((byte)uVar63 & 0x1f);
                        }
                        uVar53 = uVar53 >> (0x20 - bVar42 & 0x1f);
                        uVar38 = uVar53 + 0xf;
                        if ((int)uVar38 < 0x81) {
                          fVar86 = g_ma_dr_mp3_pow43[(int)(uVar53 + 0x1f)];
                        }
                        else {
                          uVar53 = uVar38 * 8;
                          if (uVar38 >= 0x400) {
                            uVar53 = uVar38;
                          }
                          uVar78 = uVar53 * 2 & 0x40;
                          fVar86 = (float)(int)((uVar53 & 0x3f) - uVar78) /
                                   (float)(int)((uVar53 & 0x7fffffc0) + uVar78);
                          fVar86 = ((fVar86 * 0.22222222 + 1.3333334) * fVar86 + 1.0) *
                                   g_ma_dr_mp3_pow43[(ulong)(uVar78 + uVar53 >> 6) + 0x10] *
                                   *(float *)(&DAT_00175560 + (ulong)(uVar38 < 0x400) * 4);
                        }
                        fVar86 = (float)(int)((int)uVar60 >> 0x1f | 1) * fVar86 * fVar85;
                        uVar53 = uVar60;
                      }
                      else {
                        fVar86 = g_ma_dr_mp3_pow43[(uVar53 >> 0x1b & 0xfffffff0 | uVar38) ^ 0x10] *
                                 fVar85;
                      }
                      (*pafVar47)[0] = fVar86;
                      uVar53 = uVar53 << (uVar38 != 0);
                      uVar63 = uVar63 + (uVar38 != 0);
                      pafVar47 = (float (*) [576])(*pafVar47 + 1);
                      uVar59 = uVar59 >> 4;
                    }
                    for (; -1 < (int)uVar63; uVar63 = uVar63 - 8) {
                      uVar38 = *puVar72;
                      puVar72 = (uint *)((long)puVar72 + 1);
                      uVar53 = uVar53 | (uint)(byte)uVar38 << ((byte)uVar63 & 0x1f);
                    }
                    uVar70 = uVar70 - 1;
                  } while (uVar70 != 0);
                  pbVar73 = pbVar73 + 1;
                  local_43f8 = local_43f8 + 1;
                  uVar70 = uVar54 - uVar67;
                  lVar74 = lVar1;
                } while ((uVar70 != 0 && (int)uVar67 <= (int)uVar54) &&
                        (bVar44 = 0 < (int)uVar45, uVar54 = uVar70, uVar45 = uVar45 - 1, bVar44));
              }
            }
            uVar70 = 1 - uVar70;
            puVar64 = ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                      ::tab33;
            if (pmVar2->count1_table == '\0') {
              puVar64 = ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                        ::tab32;
            }
            do {
              bVar42 = puVar64[uVar53 >> 0x1c];
              if ((bVar42 & 8) == 0) {
                bVar42 = puVar64[(ulong)((uVar53 << 4) >> (-(bVar42 & 3) & 0x1f)) +
                                 (ulong)(bVar42 >> 3)];
              }
              uVar45 = bVar42 & 7;
              sVar43 = (sbyte)uVar45;
              uVar54 = uVar53 << sVar43;
              uVar63 = uVar45 + uVar63;
              if (lVar40 < (long)(int)uVar63 + ((long)puVar72 - (long)scratch.bs.buf) * 8 + -0x18)
              goto LAB_00157a74;
              uVar70 = uVar70 - 1;
              if (uVar70 == 0) {
                bVar69 = *pbVar73;
                if (bVar69 < 2) goto LAB_00157a74;
                pbVar73 = pbVar73 + 1;
                uVar70 = (uint)(bVar69 >> 1);
                fVar85 = *local_43f8;
                local_43f8 = local_43f8 + 1;
              }
              if (0x7f < bVar42) {
                fVar86 = fVar85;
                if ((int)(uVar53 << sVar43) < 0) {
                  fVar86 = -fVar85;
                }
                (*pafVar47)[0] = fVar86;
                uVar63 = uVar63 + 1;
                uVar54 = uVar54 * 2;
              }
              uVar53 = uVar54;
              if ((bVar42 & 0x40) != 0) {
                fVar86 = fVar85;
                if ((int)uVar53 < 0) {
                  fVar86 = -fVar85;
                }
                (*pafVar47)[1] = fVar86;
                uVar53 = uVar53 * 2;
                uVar63 = uVar63 + 1;
              }
              uVar70 = uVar70 - 1;
              if (uVar70 == 0) {
                bVar69 = *pbVar73;
                if (bVar69 < 2) goto LAB_00157a74;
                pbVar73 = pbVar73 + 1;
                uVar70 = (uint)(bVar69 >> 1);
                fVar85 = *local_43f8;
                local_43f8 = local_43f8 + 1;
              }
              if ((bVar42 & 0x20) != 0) {
                fVar86 = fVar85;
                if ((int)uVar53 < 0) {
                  fVar86 = -fVar85;
                }
                (*pafVar47)[2] = fVar86;
                uVar53 = uVar53 * 2;
                uVar63 = uVar63 + 1;
              }
              if ((bVar42 & 0x10) != 0) {
                fVar86 = fVar85;
                if ((int)uVar53 < 0) {
                  fVar86 = -fVar85;
                }
                (*pafVar47)[3] = fVar86;
                uVar53 = uVar53 * 2;
                uVar63 = uVar63 + 1;
              }
              for (; -1 < (int)uVar63; uVar63 = uVar63 - 8) {
                uVar54 = *puVar72;
                puVar72 = (uint *)((long)puVar72 + 1);
                uVar53 = uVar53 | (uint)(byte)uVar54 << ((byte)uVar63 & 0x1f);
              }
              pafVar47 = (float (*) [576])(*pafVar47 + 4);
            } while( true );
          }
          bVar42 = dec->header[3];
          if ((bVar42 & 0x10) == 0) {
            if ((bVar42 & 0xe0) == 0x60) {
              ma_dr_mp3_L3_midside_stereo(scratch.grbuf[0],0x240);
            }
          }
          else {
            bVar69 = scratch.gr_info[lVar39].n_long_sfb;
            sci[0].scf[2] = -NAN;
            bVar84 = scratch.gr_info[lVar39].n_short_sfb;
            sci[0].scf[0] = -NAN;
            sci[0].scf[1] = -NAN;
            uVar53 = (uint)bVar84 + (uint)bVar69;
            pmVar82 = pmVar80->sfbtab;
            pafVar47 = scratch.grbuf + 1;
            for (uVar55 = 0; uVar55 != uVar53; uVar55 = uVar55 + 1) {
              bVar41 = pmVar82[uVar55];
              uVar79 = 0;
              while( true ) {
                if (bVar41 <= uVar79) goto LAB_00157b68;
                if (((*pafVar47)[uVar79] != 0.0) || (NAN((*pafVar47)[uVar79]))) break;
                lVar40 = uVar79 + 1;
                uVar79 = uVar79 + 2;
                if (((*pafVar47)[lVar40] != 0.0) || (NAN((*pafVar47)[lVar40]))) break;
              }
              sci[0].scf[(uVar55 & 0xffffffff) % 3] = (float)uVar55;
LAB_00157b68:
              pafVar47 = (float (*) [576])(*pafVar47 + bVar41);
            }
            if (bVar69 != 0) {
              if ((int)sci[0].scf[1] < (int)sci[0].scf[0]) {
                sci[0].scf[1] = sci[0].scf[0];
              }
              if ((int)sci[0].scf[1] <= (int)sci[0].scf[2]) {
                sci[0].scf[1] = sci[0].scf[2];
              }
              sci[0].scf[2] = sci[0].scf[1];
              sci[0].scf[0] = sci[0].scf[1];
            }
            uVar63 = (uint)(bVar84 != 0) * 2 + 1;
            lVar40 = (long)(int)(uVar53 - uVar63) + -0x59;
            for (uVar55 = 0; uVar55 != uVar63; uVar55 = uVar55 + 1) {
              if ((int)sci[0].scf[uVar55] < (int)(uVar53 + uVar63 * -2 + (int)uVar55)) {
                bVar69 = *(byte *)((long)&scratch + uVar55 + (lVar40 - (ulong)uVar63) + 0x3fb0);
              }
              else {
                bVar69 = (char)(dec->header[1] << 4) >> 7 & 3;
              }
              scratch.ist_pos[1][uVar55 + lVar40 + 0x59] = bVar69;
            }
            pmVar82 = pmVar80->sfbtab;
            mVar10 = scratch.gr_info[lVar39 + 1].scalefac_compress;
            bVar69 = dec->header[1];
            bVar84 = 7;
            if ((bVar69 & 8) == 0) {
              bVar84 = 0x40;
            }
            fVar85 = *(float *)(&DAT_00175568 + (ulong)((bVar42 & 0x20) == 0) * 4);
            uVar53 = 0;
            pafVar47 = scratch.grbuf;
            while( true ) {
              uVar55 = (ulong)uVar53;
              bVar41 = pmVar82[uVar55];
              if ((ulong)bVar41 == 0) break;
              if ((int)sci[0].scf[uVar55 % 3] < (int)uVar53) {
                bVar6 = scratch.ist_pos[1][uVar55];
                if (bVar84 <= bVar6) goto LAB_00157cda;
                if ((bVar69 & 8) == 0) {
                  fVar87 = ma_dr_mp3_L3_ldexp_q2(1.0,(bVar6 + 1 >> 1) << ((byte)mVar10 & 1));
                  if ((bVar6 & 1) == 0) {
                    fVar86 = fVar87;
                    fVar87 = 1.0;
                  }
                  else {
                    fVar86 = 1.0;
                  }
                }
                else {
                  fVar86 = *(float *)(ma_dr_mp3_L3_stereo_process(float*,unsigned_char_const*,unsigned_char_const*,unsigned_char_const*,int*,int)
                                      ::g_pan + (ulong)bVar6 * 8 + 4);
                  fVar87 = *(float *)(ma_dr_mp3_L3_stereo_process(float*,unsigned_char_const*,unsigned_char_const*,unsigned_char_const*,int*,int)
                                      ::g_pan + (ulong)bVar6 * 8);
                }
                for (uVar79 = 0; bVar41 != uVar79; uVar79 = uVar79 + 1) {
                  pafVar47[1][uVar79] = fVar86 * fVar85 * (*pafVar47)[uVar79];
                  (*pafVar47)[uVar79] = (*pafVar47)[uVar79] * fVar87 * fVar85;
                }
              }
              else {
LAB_00157cda:
                if ((bVar42 & 0x20) != 0) {
                  ma_dr_mp3_L3_midside_stereo(*pafVar47,(uint)bVar41);
                }
              }
              pafVar47 = (float (*) [576])(*pafVar47 + pmVar82[uVar55]);
              uVar53 = uVar53 + 1;
            }
          }
          pmVar68 = &scratch;
          for (uVar55 = 0; uVar55 != uVar46; uVar55 = uVar55 + 1) {
            mVar26 = pmVar80->mixed_block_flag;
            iVar51 = (uint)(mVar26 != '\0') * 2 <<
                     ((byte)(((dec->header[1] >> 3 & 1) + ((dec->header[1] >> 4 & 1) != 0)) * '\x03'
                            + (dec->header[2] >> 2 & 3)) == '\x02');
            iVar29 = 0x1f;
            if (pmVar80->n_short_sfb != '\0') {
              __dest = (void *)((long)scratch.grbuf[uVar55] + (ulong)(uint)(iVar51 * 0x48));
              pbVar73 = pmVar80->sfbtab + pmVar80->n_long_sfb;
              pafVar50 = scratch.syn;
              pvVar65 = __dest;
              while( true ) {
                uVar79 = (ulong)*pbVar73;
                if (uVar79 == 0) break;
                uVar53 = (uint)*pbVar73 * 4;
                for (lVar39 = 0; uVar53 != (uint)lVar39; lVar39 = lVar39 + 4) {
                  (*pafVar50)[0] = *(float *)((long)pvVar65 + lVar39);
                  (*pafVar50)[1] = *(float *)((long)pvVar65 + lVar39 + (ulong)uVar53);
                  (*pafVar50)[2] = *(float *)((long)pvVar65 + lVar39 + uVar79 * 8);
                  pafVar50 = (float (*) [64])(*pafVar50 + 3);
                }
                pbVar73 = pbVar73 + 3;
                pvVar65 = (void *)((long)pvVar65 + lVar39 + uVar79 * 8);
              }
              iVar29 = iVar51 + -1;
              memcpy(__dest,scratch.syn,(long)pafVar50 - (long)scratch.syn);
            }
            local_43f0 = scratch.grbuf + uVar55;
            pafVar47 = local_43f0;
            for (; 0 < iVar29; iVar29 = iVar29 + -1) {
              lVar39 = 0;
              bVar44 = true;
              do {
                bVar49 = bVar44;
                pfVar57 = *pafVar47 + lVar39 + 0x12;
                fVar85 = *pfVar57;
                fVar86 = pfVar57[1];
                fVar87 = pfVar57[2];
                fVar11 = pfVar57[3];
                fVar12 = *(float *)((long)pafVar47 + (0xe - lVar39) * 4);
                fVar13 = *(float *)((long)pafVar47 + (0xf - lVar39) * 4);
                fVar14 = *(float *)((long)pafVar47 + (0x10 - lVar39) * 4);
                fVar15 = *(float *)((long)pafVar47 + (0x11 - lVar39) * 4);
                lVar40 = lVar39 * 4;
                fVar16 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar40);
                fVar17 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar40 + 4);
                fVar18 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar40 + 8);
                fVar19 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar40 + 0xc);
                lVar40 = lVar39 * 4;
                fVar20 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar40 + 0x20);
                fVar21 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar40 + 0x24);
                fVar22 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar40 + 0x28);
                fVar23 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar40 + 0x2c);
                pfVar57 = *pafVar47 + lVar39 + 0x12;
                *pfVar57 = fVar85 * fVar16 - fVar15 * fVar20;
                pfVar57[1] = fVar86 * fVar17 - fVar14 * fVar21;
                pfVar57[2] = fVar87 * fVar18 - fVar13 * fVar22;
                pfVar57[3] = fVar11 * fVar19 - fVar12 * fVar23;
                *(float *)((long)pafVar47 + (0xe - lVar39) * 4) = fVar12 * fVar19 + fVar11 * fVar23;
                *(float *)((long)pafVar47 + (0xf - lVar39) * 4) = fVar13 * fVar18 + fVar87 * fVar22;
                *(float *)((long)pafVar47 + (0x10 - lVar39) * 4) = fVar14 * fVar17 + fVar86 * fVar21
                ;
                *(float *)((long)pafVar47 + (0x11 - lVar39) * 4) = fVar15 * fVar16 + fVar85 * fVar20
                ;
                lVar39 = 4;
                bVar44 = false;
              } while (bVar49);
              pafVar47 = (float (*) [576])(*pafVar47 + 0x12);
            }
            overlap = dec->mdct_overlap + uVar55;
            mVar25 = pmVar80->block_type;
            if (mVar26 != '\0') {
              ma_dr_mp3_L3_imdct36
                        (*local_43f0,*overlap,
                         (float *)ma_dr_mp3_L3_imdct_gr(float*,float*,unsigned_int,unsigned_int)::
                                  g_mdct_window,iVar51);
              local_43f0 = (float (*) [576])((long)*local_43f0 + (ulong)(uint)(iVar51 * 0x48));
              overlap = (float (*) [288])((long)*overlap + (ulong)(uint)(iVar51 * 0x24));
            }
            if (mVar25 == '\x02') {
              lVar39 = 0;
              for (iVar51 = 0x20 - iVar51; 0 < iVar51; iVar51 = iVar51 + -1) {
                pfVar57 = (float *)((long)*local_43f0 + lVar39 * 2);
                dst = (float *)((long)*overlap + lVar39);
                pfVar66 = pfVar57;
                pmVar56 = sci;
                for (lVar40 = 0x12; lVar40 != 0; lVar40 = lVar40 + -1) {
                  pmVar56->scf[0] = *pfVar66;
                  pfVar66 = pfVar66 + (ulong)bVar27 * -2 + 1;
                  pmVar56 = (ma_dr_mp3_L12_scale_info *)((long)pmVar56 + (ulong)bVar27 * -8 + 4);
                }
                *(undefined8 *)(pfVar57 + 4) = *(undefined8 *)(dst + 4);
                uVar24 = *(undefined8 *)(dst + 2);
                *(undefined8 *)pfVar57 = *(undefined8 *)dst;
                *(undefined8 *)(pfVar57 + 2) = uVar24;
                pfVar66 = dst + 6;
                ma_dr_mp3_L3_imdct12(sci[0].scf,pfVar57 + 6,pfVar66);
                ma_dr_mp3_L3_imdct12(sci[0].scf + 1,pfVar57 + 0xc,pfVar66);
                ma_dr_mp3_L3_imdct12(sci[0].scf + 2,dst,pfVar66);
                lVar39 = lVar39 + 0x24;
              }
            }
            else {
              ma_dr_mp3_L3_imdct36
                        (*local_43f0,*overlap,
                         (float *)(ma_dr_mp3_L3_imdct_gr(float*,float*,unsigned_int,unsigned_int)::
                                   g_mdct_window + (ulong)(mVar25 == '\x03') * 0x48),0x20 - iVar51);
            }
            pmVar48 = pmVar68;
            for (uVar53 = 0; uVar53 < 0x20; uVar53 = uVar53 + 2) {
              for (lVar39 = 0x2f7; lVar39 - 0x2f6U < 0x12; lVar39 = lVar39 + 2) {
                *(uint *)(pmVar48->maindata + lVar39 * 4 + -0x10) =
                     *(uint *)(pmVar48->maindata + lVar39 * 4 + -0x10) ^ 0x80000000;
              }
              pmVar48 = (ma_dr_mp3dec_scratch *)(pmVar48->maindata + 0x80);
            }
            pmVar80 = pmVar80 + 1;
            pmVar68 = (ma_dr_mp3dec_scratch *)(pmVar68->maindata + 0x8f0);
          }
          ma_dr_mp3d_synth_granule
                    (dec->qmf_state,scratch.grbuf[0],0x12,info->channels,local_4370,scratch.syn[0]);
          local_4380 = (ulong)info->channels;
          local_4370 = local_4370 + local_4380 * 0x240;
          bVar42 = pmVar83[1];
        }
        uVar53 = scratch.bs.pos + 7U >> 3;
      }
      uVar63 = ((uint)scratch.bs.limit >> 3) - uVar53;
      uVar58 = 0x1ff;
      if ((int)uVar63 < 0x1ff) {
        uVar58 = uVar63;
      }
      if (0 < (int)uVar63) {
        if (0x1ff < uVar63) {
          uVar53 = ((uint)scratch.bs.limit >> 3) - 0x1ff;
        }
        memcpy(dec->reserv_buf,scratch.maindata + uVar53,(ulong)uVar58);
      }
      dec->reserv = uVar58;
      uVar28 = (uint)((int)uVar35 <= (int)uVar28);
LAB_00158252:
      uVar58 = ma_dr_mp3_hdr_frame_samples(dec->header);
      return uVar58 * uVar28;
    }
  }
  else {
    if (pcm == (void *)0x0) {
      uVar28 = ma_dr_mp3_hdr_frame_samples(pmVar83);
      return uVar28;
    }
    uVar28 = 0x20;
    bVar27 = pmVar83[3] >> 6;
    if (bVar27 == 3) {
      uVar58 = 0;
    }
    else {
      uVar58 = uVar28;
      if (bVar27 == 1) {
        uVar58 = (pmVar83[3] >> 2 & 0xc) + 4;
      }
    }
    if ((~bVar42 & 6) == 0) {
      puVar64 = &ma_dr_mp3_L12_subband_alloc_table(unsigned_char_const*,ma_dr_mp3_L12_scale_info*)::
                 g_alloc_L1;
    }
    else if ((bVar42 & 8) == 0) {
      puVar64 = &ma_dr_mp3_L12_subband_alloc_table(unsigned_char_const*,ma_dr_mp3_L12_scale_info*)::
                 g_alloc_L2M2;
      uVar28 = 0x1e;
    }
    else {
      bVar69 = pmVar83[2] >> 2 & 3;
      uVar35 = ma_dr_mp3_hdr_bitrate_kbps(pmVar83);
      uVar28 = 0xc0;
      if (uVar35 >> (bVar27 != 3) != 0) {
        uVar28 = uVar35 >> (bVar27 != 3);
      }
      if (uVar28 < 0x38) {
        uVar28 = (uint)(bVar69 == 2) * 4 + 8;
        puVar64 = (undefined1 *)
                  &ma_dr_mp3_L12_subband_alloc_table(unsigned_char_const*,ma_dr_mp3_L12_scale_info*)
                   ::g_alloc_L2M1_lowrate;
      }
      else {
        bVar44 = bVar69 != 1 && 0x5f < uVar28;
        uVar28 = (uint)bVar44 + (uint)bVar44 * 2 + 0x1b;
        puVar64 = ma_dr_mp3_L12_subband_alloc_table(unsigned_char_const*,ma_dr_mp3_L12_scale_info*)
                  ::g_alloc_L2M1;
      }
    }
    local_43f8 = (float *)sci[0].bitalloc;
    sci[0].total_bands = (ma_uint8)uVar28;
    uVar35 = uVar28;
    if (uVar58 < uVar28) {
      uVar35 = uVar58;
    }
    uVar46 = (ulong)uVar35;
    sci[0].stereo_bands = (ma_uint8)uVar35;
    puVar81 = ma_dr_mp3_L12_read_scale_info(unsigned_char_const*,ma_dr_mp3_bs*,ma_dr_mp3_L12_scale_info*)
              ::g_bitalloc_code_tab;
    uVar55 = 0;
    uVar35 = 0;
    for (uVar79 = 0; uVar28 != uVar79; uVar79 = uVar79 + 1) {
      if (uVar79 == uVar55) {
        uVar55 = (ulong)((int)uVar55 + (uint)(byte)puVar64[2]);
        uVar35 = (uint)(byte)puVar64[1];
        puVar81 = ma_dr_mp3_L12_read_scale_info(unsigned_char_const*,ma_dr_mp3_bs*,ma_dr_mp3_L12_scale_info*)
                  ::g_bitalloc_code_tab + (byte)*puVar64;
        puVar64 = puVar64 + 3;
      }
      mVar36 = ma_dr_mp3_bs_get_bits(bs_frame,uVar35);
      mVar26 = puVar81[mVar36];
      sci[0].bitalloc[uVar79 * 2] = mVar26;
      if (uVar79 < uVar46) {
        mVar36 = ma_dr_mp3_bs_get_bits(bs_frame,uVar35);
        mVar26 = puVar81[mVar36];
      }
      if (uVar58 == 0) {
        mVar26 = '\0';
      }
      sci[0].bitalloc[uVar79 * 2 + 1] = mVar26;
    }
    for (uVar55 = 0; uVar28 * 2 != uVar55; uVar55 = uVar55 + 1) {
      bVar27 = (sci[0].bitalloc[uVar55] == '\0') << 2 | 2;
      if ((sci[0].bitalloc[uVar55] != '\0') && ((bVar42 & 6) != 6)) {
        mVar36 = ma_dr_mp3_bs_get_bits(bs_frame,2);
        bVar27 = (byte)mVar36;
      }
      sci[0].scfcod[uVar55] = bVar27;
    }
    pmVar56 = sci;
    for (uVar55 = 0; uVar55 != uVar28 * 2; uVar55 = uVar55 + 1) {
      bVar27 = *(byte *)local_43f8;
      if (bVar27 == 0) {
        uVar58 = 0;
      }
      else {
        uVar58 = 0x13U >> (sci[0].scfcod[uVar55] & 0x1f) | 4;
      }
      local_43f8 = (float *)((long)local_43f8 + 1);
      fVar85 = 0.0;
      for (uVar35 = 4; uVar35 != 0; uVar35 = uVar35 >> 1) {
        if ((uVar35 & uVar58) != 0) {
          mVar36 = ma_dr_mp3_bs_get_bits(bs_frame,6);
          fVar85 = (float)(int)(0x200000 >> ((byte)((int)mVar36 / 3) & 0x1f)) *
                   *(float *)(ma_dr_mp3_L12_read_scalefactors(ma_dr_mp3_bs*,unsigned_char*,unsigned_char*,int,float*)
                              ::g_deq_L12 +
                             (long)(int)((int)mVar36 % 3 + (uint)bVar27 + (uint)bVar27 * 2 + -6) * 4
                             );
        }
        pmVar56->scf[0] = fVar85;
        pmVar56 = (ma_dr_mp3_L12_scale_info *)(pmVar56->scf + 1);
      }
    }
    for (; uVar28 != uVar46; uVar46 = uVar46 + 1) {
      sci[0].bitalloc[uVar46 * 2 + 1] = '\0';
    }
    memset(scratch.grbuf,0,0x1200);
    lVar39 = 0;
    iVar29 = 0;
    do {
      mVar26 = sci[0].total_bands;
      uVar28 = 1;
      if (lVar39 == 3) goto LAB_00158252;
      uVar46 = (long)info->layer | 1;
      iVar51 = (int)uVar46;
      uVar55 = 0;
      if (0 < iVar51) {
        uVar55 = (ulong)(uint)info->layer | 1;
      }
      uVar79 = (ulong)sci[0].total_bands;
      uVar28 = (uint)sci[0].total_bands;
      iVar77 = 0x240;
      for (lVar40 = 0; lVar40 != 4; lVar40 = lVar40 + 1) {
        pfVar57 = scratch.grbuf[0] + (long)iVar29 + lVar40 * uVar46;
        for (uVar61 = 0; uVar61 != uVar28 * 2; uVar61 = uVar61 + 1) {
          bVar27 = sci[0].bitalloc[uVar61];
          if (bVar27 != 0) {
            if (bVar27 < 0x11) {
              for (uVar62 = 0; uVar55 != uVar62; uVar62 = uVar62 + 1) {
                mVar36 = ma_dr_mp3_bs_get_bits(bs_frame,(uint)bVar27);
                pfVar57[uVar62] = (float)(int)(mVar36 + (-1 << (bVar27 - 1 & 0x1f)) + 1);
              }
            }
            else {
              uVar58 = 2 << (bVar27 - 0x11 & 0x1f);
              mVar36 = ma_dr_mp3_bs_get_bits(bs_frame,(uVar58 - (uVar58 >> 3)) + 3);
              for (uVar62 = 0; uVar55 != uVar62; uVar62 = uVar62 + 1) {
                pfVar57[uVar62] = (float)(int)(mVar36 % (uVar58 + 1) - (uVar58 >> 1));
                mVar36 = mVar36 / (uVar58 + 1);
              }
            }
          }
          pfVar57 = pfVar57 + iVar77;
          iVar77 = 0x12 - iVar77;
        }
      }
      iVar29 = iVar29 + iVar51 * 4;
      if (iVar29 == 0xc) {
        pfVar57 = sci[0].scf + lVar39;
        pafVar47 = scratch.grbuf;
        memcpy((void *)((long)scratch.grbuf[1] + (ulong)((uint)sci[0].stereo_bands * 0x48)),
               (void *)((long)*pafVar47 + (ulong)((uint)sci[0].stereo_bands * 0x48)),
               (uVar79 - sci[0].stereo_bands) * 0x48);
        for (uVar28 = 0; local_43b8 = (uint)mVar26, uVar28 != local_43b8; uVar28 = uVar28 + 1) {
          fVar85 = *pfVar57;
          fVar86 = pfVar57[3];
          for (lVar40 = 0; lVar40 != 0xc; lVar40 = lVar40 + 1) {
            (*pafVar47)[lVar40] = (*pafVar47)[lVar40] * fVar85;
            pafVar47[1][lVar40] = pafVar47[1][lVar40] * fVar86;
          }
          pafVar47 = (float (*) [576])(*pafVar47 + 0x12);
          pfVar57 = pfVar57 + 6;
        }
        ma_dr_mp3d_synth_granule
                  (dec->qmf_state,scratch.grbuf[0],0xc,(int)local_4380,local_4370,scratch.syn[0]);
        iVar29 = 0;
        memset(scratch.grbuf,0,0x1200);
        local_4380 = (ulong)info->channels;
        local_4370 = local_4370 + local_4380 * 0x180;
      }
      lVar39 = lVar39 + 1;
    } while (bs_frame[0].pos <= bs_frame[0].limit);
  }
LAB_00158705:
  dec->header[0] = '\0';
  return 0;
LAB_00157a74:
  scratch.bs.pos = (int)lVar40;
  uVar55 = uVar55 + 1;
  goto LAB_0015724c;
}

Assistant:

MA_API int ma_dr_mp3dec_decode_frame(ma_dr_mp3dec *dec, const ma_uint8 *mp3, int mp3_bytes, void *pcm, ma_dr_mp3dec_frame_info *info)
{
    int i = 0, igr, frame_size = 0, success = 1;
    const ma_uint8 *hdr;
    ma_dr_mp3_bs bs_frame[1];
    ma_dr_mp3dec_scratch scratch;
    if (mp3_bytes > 4 && dec->header[0] == 0xff && ma_dr_mp3_hdr_compare(dec->header, mp3))
    {
        frame_size = ma_dr_mp3_hdr_frame_bytes(mp3, dec->free_format_bytes) + ma_dr_mp3_hdr_padding(mp3);
        if (frame_size != mp3_bytes && (frame_size + MA_DR_MP3_HDR_SIZE > mp3_bytes || !ma_dr_mp3_hdr_compare(mp3, mp3 + frame_size)))
        {
            frame_size = 0;
        }
    }
    if (!frame_size)
    {
        MA_DR_MP3_ZERO_MEMORY(dec, sizeof(ma_dr_mp3dec));
        i = ma_dr_mp3d_find_frame(mp3, mp3_bytes, &dec->free_format_bytes, &frame_size);
        if (!frame_size || i + frame_size > mp3_bytes)
        {
            info->frame_bytes = i;
            return 0;
        }
    }
    hdr = mp3 + i;
    MA_DR_MP3_COPY_MEMORY(dec->header, hdr, MA_DR_MP3_HDR_SIZE);
    info->frame_bytes = i + frame_size;
    info->channels = MA_DR_MP3_HDR_IS_MONO(hdr) ? 1 : 2;
    info->hz = ma_dr_mp3_hdr_sample_rate_hz(hdr);
    info->layer = 4 - MA_DR_MP3_HDR_GET_LAYER(hdr);
    info->bitrate_kbps = ma_dr_mp3_hdr_bitrate_kbps(hdr);
    ma_dr_mp3_bs_init(bs_frame, hdr + MA_DR_MP3_HDR_SIZE, frame_size - MA_DR_MP3_HDR_SIZE);
    if (MA_DR_MP3_HDR_IS_CRC(hdr))
    {
        ma_dr_mp3_bs_get_bits(bs_frame, 16);
    }
    if (info->layer == 3)
    {
        int main_data_begin = ma_dr_mp3_L3_read_side_info(bs_frame, scratch.gr_info, hdr);
        if (main_data_begin < 0 || bs_frame->pos > bs_frame->limit)
        {
            ma_dr_mp3dec_init(dec);
            return 0;
        }
        success = ma_dr_mp3_L3_restore_reservoir(dec, bs_frame, &scratch, main_data_begin);
        if (success && pcm != NULL)
        {
            for (igr = 0; igr < (MA_DR_MP3_HDR_TEST_MPEG1(hdr) ? 2 : 1); igr++, pcm = MA_DR_MP3_OFFSET_PTR(pcm, sizeof(ma_dr_mp3d_sample_t)*576*info->channels))
            {
                MA_DR_MP3_ZERO_MEMORY(scratch.grbuf[0], 576*2*sizeof(float));
                ma_dr_mp3_L3_decode(dec, &scratch, scratch.gr_info + igr*info->channels, info->channels);
                ma_dr_mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 18, info->channels, (ma_dr_mp3d_sample_t*)pcm, scratch.syn[0]);
            }
        }
        ma_dr_mp3_L3_save_reservoir(dec, &scratch);
    } else
    {
#ifdef MA_DR_MP3_ONLY_MP3
        return 0;
#else
        ma_dr_mp3_L12_scale_info sci[1];
        if (pcm == NULL) {
            return ma_dr_mp3_hdr_frame_samples(hdr);
        }
        ma_dr_mp3_L12_read_scale_info(hdr, bs_frame, sci);
        MA_DR_MP3_ZERO_MEMORY(scratch.grbuf[0], 576*2*sizeof(float));
        for (i = 0, igr = 0; igr < 3; igr++)
        {
            if (12 == (i += ma_dr_mp3_L12_dequantize_granule(scratch.grbuf[0] + i, bs_frame, sci, info->layer | 1)))
            {
                i = 0;
                ma_dr_mp3_L12_apply_scf_384(sci, sci->scf + igr, scratch.grbuf[0]);
                ma_dr_mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 12, info->channels, (ma_dr_mp3d_sample_t*)pcm, scratch.syn[0]);
                MA_DR_MP3_ZERO_MEMORY(scratch.grbuf[0], 576*2*sizeof(float));
                pcm = MA_DR_MP3_OFFSET_PTR(pcm, sizeof(ma_dr_mp3d_sample_t)*384*info->channels);
            }
            if (bs_frame->pos > bs_frame->limit)
            {
                ma_dr_mp3dec_init(dec);
                return 0;
            }
        }
#endif
    }
    return success*ma_dr_mp3_hdr_frame_samples(dec->header);
}